

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall dnet::data_types::matrix::matrix(matrix *this,double def,axes_type *size)

{
  axes_type *size_local;
  double def_local;
  matrix *this_local;
  
  size_local = (axes_type *)def;
  def_local = (double)this;
  tensor<double,_2U>::tensor
            (&this->super_tensor<double,_2U>,(double *)&size_local,
             (array<unsigned_int,_2UL>)*&size->_M_elems);
  return;
}

Assistant:

matrix::matrix(double def, const axes_type &size) : tensor(def, size) {}